

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O2

void Eto63(Clifford *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  vector<Blade,_std::allocator<Blade>_> local_220;
  vector<Blade,_std::allocator<Blade>_> local_208;
  Clifford local_1f0;
  vector<Blade,_std::allocator<Blade>_> local_1d8;
  Clifford local_1c0;
  vector<Blade,_std::allocator<Blade>_> local_1a8;
  Clifford local_190;
  Clifford local_178;
  Clifford local_160;
  Clifford local_148;
  vector<Blade,_std::allocator<Blade>_> local_130;
  Clifford local_118;
  vector<Blade,_std::allocator<Blade>_> local_100;
  vector<Blade,_std::allocator<Blade>_> local_e8;
  Clifford local_d0;
  vector<Blade,_std::allocator<Blade>_> local_b8;
  vector<Blade,_std::allocator<Blade>_> local_a0;
  Clifford local_88;
  vector<Blade,_std::allocator<Blade>_> local_70;
  vector<Blade,_std::allocator<Blade>_> local_58;
  Clifford local_40;
  Clifford local_28;
  
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_58,p);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_70,&e1);
  operator|(&local_40,&local_58,&local_70);
  if (local_40.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_40.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    fVar1 = 0.0;
  }
  else {
    fVar1 = (local_40.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
             super__Vector_impl_data._M_start)->mVal;
  }
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_40);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_70);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_58);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_a0,p);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_b8,&e2);
  operator|(&local_88,&local_a0,&local_b8);
  if (local_88.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_88.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    fVar2 = 0.0;
  }
  else {
    fVar2 = (local_88.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
             super__Vector_impl_data._M_start)->mVal;
  }
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_88);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_b8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_a0);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_e8,p);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_100,&e3);
  operator|(&local_d0,&local_e8,&local_100);
  if (local_d0.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_d0.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    fVar3 = 0.0;
  }
  else {
    fVar3 = (local_d0.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
             super__Vector_impl_data._M_start)->mVal;
  }
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_d0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_100);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_e8);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_130,p);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_1a8,&ex);
  operator*(&local_190,fVar1 * fVar1,&local_1a8);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_1d8,&ey);
  operator*(&local_1c0,fVar2 * fVar2,&local_1d8);
  operator+(&local_178,&local_190,&local_1c0);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_208,&ez);
  operator*(&local_1f0,fVar3 * fVar3,&local_208);
  operator+(&local_160,&local_178,&local_1f0);
  operator*(&local_148,0.5,&local_160);
  operator+(&local_118,&local_130,&local_148);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_220,&eo);
  operator+(&local_28,&local_118,&local_220);
  std::vector<Blade,_std::allocator<Blade>_>::_M_move_assign(p,&local_28);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_28);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_220);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_118);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_148);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_160);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1f0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_208);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_178);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1c0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1d8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_190);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1a8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_130);
  return;
}

Assistant:

void Eto63(Clifford &p)
{
   float x;x<=(p|e1);
   float y;y<=(p|e2);
   float z;z<=(p|e3);
   p=p+0.5*(x*x*ex+y*y*ey+z*z*ez)+eo;
}